

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O3

void duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>::
     Finalize<duckdb::interval_t,duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> *state,
               interval_t *target,AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  timestamp_t *v_t;
  reference pvVar2;
  idx_t iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  interval_t iVar6;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> accessor;
  timestamp_t med;
  Interpolator<false> interp;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> local_80;
  double local_78;
  double dStack_70;
  MEDIAN_TYPE local_68;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>.
      super__Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>.
      super__Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pvVar2 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)((this->bind_data).ptr + 1),0);
    v_t = (state->v).super_vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>.
          super__Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>._M_impl.
          super__Vector_impl_data._M_start;
    iVar3 = (long)(state->v).super_vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>
                  .super__Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)v_t >> 3;
    local_60.desc = false;
    lVar1 = iVar3 - 1;
    auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    dStack_70 = auVar5._8_8_ - 1.9342813113834067e+25;
    local_78 = (dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
               pvVar2->dbl;
    local_60.RN = local_78;
    dVar4 = floor(local_78);
    local_60.FRN = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    dVar4 = ceil(local_78);
    local_60.CRN = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    local_60.begin = 0;
    local_60.end = iVar3;
    local_68.value =
         (int64_t)Interpolator<false>::
                  Operation<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::QuantileDirect<duckdb::timestamp_t>>
                            (&local_60,v_t,finalize_data->result,
                             (QuantileDirect<duckdb::timestamp_t> *)&local_80);
    local_80.median = &local_68;
    iVar6 = Interpolator<false>::
            Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>>
                      (&local_60,
                       (state->v).
                       super_vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>.
                       super__Vector_base<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>
                       ._M_impl.super__Vector_impl_data._M_start,finalize_data->result,&local_80);
    *target = iVar6;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}